

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzchangeel.cpp
# Opt level: O3

TPZGeoEl * TPZChangeEl::ChangeToGeoBlend(TPZGeoMesh *Mesh,int64_t ElemIndex)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  TPZGeoEl **ppTVar6;
  undefined4 extraout_var;
  long lVar8;
  ulong uVar9;
  int64_t oldId;
  TPZVec<TPZGeoElSide> oldNeigh;
  TPZGeoElSide neigh;
  TPZManVector<long,_10> nodeindexes;
  int64_t local_e0;
  TPZVec<TPZGeoElSide> local_d8;
  undefined **local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  TPZManVector<long,_10> local_a0;
  TPZGeoEl *pTVar7;
  
  ppTVar6 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                      (&(Mesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,ElemIndex);
  pTVar7 = *ppTVar6;
  if (pTVar7 == (TPZGeoEl *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error at ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "static TPZGeoEl *TPZChangeEl::ChangeToGeoBlend(TPZGeoMesh *, int64_t)",0x45);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," - NULL geometric element.\n",0x1b);
    pTVar7 = (TPZGeoEl *)0x0;
  }
  else {
    uVar2 = (**(code **)(*(long *)pTVar7 + 0xb8))(pTVar7);
    local_e0 = pTVar7->fId;
    uVar1 = pTVar7->fMatId;
    uVar3 = (**(code **)(*(long *)pTVar7 + 0xf0))(pTVar7);
    TPZVec<TPZGeoElSide>::TPZVec(&local_d8,(long)(int)uVar3);
    if (0 < (int)uVar3) {
      lVar8 = 8;
      uVar9 = 0;
      do {
        (**(code **)(*(long *)pTVar7 + 0x188))(&local_a0,pTVar7,uVar9 & 0xffffffff);
        *(undefined4 *)((long)&(local_d8.fStore)->fGeoEl + lVar8) =
             (undefined4)local_a0.super_TPZVec<long>.fNElements;
        *(long **)((long)&((local_d8.fStore)->super_TPZSavable)._vptr_TPZSavable + lVar8) =
             local_a0.super_TPZVec<long>.fStore;
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x18;
      } while (uVar3 != uVar9);
    }
    uVar4 = (**(code **)(*(long *)pTVar7 + 0x98))(pTVar7);
    TPZManVector<long,_10>::TPZManVector(&local_a0,(long)(int)uVar4);
    if (0 < (int)uVar4) {
      uVar9 = 0;
      do {
        lVar8 = (**(code **)(*(long *)pTVar7 + 0xa8))(pTVar7,uVar9 & 0xffffffff);
        local_a0.super_TPZVec<long>.fStore[uVar9] = lVar8;
        uVar9 = uVar9 + 1;
      } while (uVar4 != uVar9);
    }
    TPZGeoMesh::DeleteElement(Mesh,pTVar7,-1);
    iVar5 = (*(Mesh->super_TPZSavable)._vptr_TPZSavable[0xd])
                      (Mesh,(ulong)uVar2,&local_a0,(ulong)uVar1,&local_e0);
    pTVar7 = (TPZGeoEl *)CONCAT44(extraout_var,iVar5);
    if (0 < (int)uVar3) {
      lVar8 = 8;
      uVar9 = 0;
      do {
        local_b8 = &PTR__TPZGeoElSide_018f8760;
        local_a8 = *(undefined4 *)((long)&(local_d8.fStore)->fGeoEl + lVar8);
        local_b0 = *(undefined8 *)
                    ((long)&((local_d8.fStore)->super_TPZSavable)._vptr_TPZSavable + lVar8);
        (**(code **)(*(long *)pTVar7 + 0x198))(pTVar7,uVar9 & 0xffffffff,&local_b8);
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x18;
      } while (uVar3 != uVar9);
    }
    TPZGeoEl::BuildBlendConnectivity(pTVar7);
    TPZManVector<long,_10>::~TPZManVector(&local_a0);
    local_d8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018141b0;
    if (local_d8.fStore != (TPZGeoElSide *)0x0) {
      operator_delete__(&local_d8.fStore[-1].fSide,*(long *)&local_d8.fStore[-1].fSide * 0x18 + 8);
    }
  }
  return pTVar7;
}

Assistant:

TPZGeoEl * TPZChangeEl::ChangeToGeoBlend(TPZGeoMesh *Mesh, int64_t ElemIndex)
{
	TPZGeoEl * OldElem = Mesh->ElementVec()[ElemIndex];
	if(!OldElem)
    {
		PZError << "Error at " << __PRETTY_FUNCTION__ << " - NULL geometric element.\n";
		return NULL;
	}
    MElementType oldType = OldElem->Type();
    int64_t oldId = OldElem->Id();
    int64_t oldMatId = OldElem->MaterialId();
    int nsides = OldElem->NSides();
    
    TPZVec<TPZGeoElSide> oldNeigh(nsides);
    for(int s = 0; s < nsides; s++)
    {   
        TPZGeoElSide mySide(OldElem, s);
        oldNeigh[s] = mySide.Neighbour();
    }
	
	const int nnodes = OldElem->NCornerNodes();
	TPZManVector<int64_t> nodeindexes(nnodes);
	for(int i = 0; i < nnodes; i++)
    {
        nodeindexes[i] = OldElem->NodeIndex(i);
    }
    
    Mesh->DeleteElement(OldElem);
    
	TPZGeoEl * NewElem = Mesh->CreateGeoBlendElement(oldType, nodeindexes, oldMatId, oldId);

    for(int s = 0; s < nsides; s++)
    {   
        TPZGeoElSide neigh = oldNeigh[s];
        NewElem->SetNeighbour(s, neigh);
    }
    
	NewElem->BuildBlendConnectivity();
	
	return NewElem;
}